

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

uint aom_obmc_sub_pixel_variance64x16_c
               (uint8_t *pre,int pre_stride,int xoffset,int yoffset,int32_t *wsrc,int32_t *mask,
               uint *sse)

{
  uint uVar1;
  uint8_t *in_stack_fffffffffffff338;
  uint8_t temp2 [1024];
  uint16_t fdata3 [1088];
  
  var_filter_block2d_bil_first_pass_c
            (pre,fdata3,pre_stride,0x11,0x40,xoffset * 2 + 0x46a570,in_stack_fffffffffffff338);
  var_filter_block2d_bil_second_pass_c
            (fdata3,temp2,0x40,0x40,0x10,0x40,bilinear_filters_2t[yoffset]);
  uVar1 = aom_obmc_variance64x16_c(temp2,0x40,wsrc,mask,sse);
  return uVar1;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}